

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::SetImportLinkInterface
          (cmExportFileGenerator *this,string *config,string *suffix,
          PreprocessContext preprocessRule,cmGeneratorTarget *target,ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  PolicyStatus PVar1;
  cmLinkInterface *entries;
  char *__s;
  mapped_type *pmVar2;
  cmLocalGenerator *this_00;
  ostream *poVar3;
  string *psVar4;
  allocator<char> local_1c9;
  string local_1c8;
  string prepro;
  
  entries = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (entries != (cmLinkInterface *)0x0) {
    if (entries->ImplementationIsInterface == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prepro,"IMPORTED_LINK_INTERFACE_LIBRARIES",(allocator<char> *)&local_1c8
                );
      SetImportLinkProperty<cmLinkItem>
                (this,suffix,target,&prepro,
                 (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)entries,properties,
                 missingTargets);
    }
    else {
      std::operator+(&prepro,"LINK_INTERFACE_LIBRARIES",suffix);
      __s = cmGeneratorTarget::GetProperty(target,&prepro);
      std::__cxx11::string::~string((string *)&prepro);
      if (__s == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prepro,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)&local_1c8);
        __s = cmGeneratorTarget::GetProperty(target,&prepro);
        std::__cxx11::string::~string((string *)&prepro);
        if (__s == (char *)0x0) {
          return;
        }
      }
      PVar1 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
      if (((PVar1 != WARN) &&
          (PVar1 = cmGeneratorTarget::GetPolicyStatusCMP0022(target), PVar1 != OLD)) &&
         (this->ExportOld == false)) {
        this_00 = cmGeneratorTarget::GetLocalGenerator(target);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&prepro);
        poVar3 = std::operator<<((ostream *)&prepro,"Target \"");
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        std::operator<<(poVar3,
                        "\" has policy CMP0022 enabled, but also has old-style LINK_INTERFACE_LIBRARIES properties populated, but it was exported without the EXPORT_LINK_INTERFACE_LIBRARIES to export the old-style properties"
                       );
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prepro);
        return;
      }
      if (*__s == '\0') {
        std::operator+(&prepro,"IMPORTED_LINK_INTERFACE_LIBRARIES",suffix);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&prepro);
        pmVar2->_M_string_length = 0;
        *(pmVar2->_M_dataplus)._M_p = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,__s,&local_1c9);
        cmGeneratorExpression::Preprocess(&prepro,&local_1c8,preprocessRule,false);
        std::__cxx11::string::~string((string *)&local_1c8);
        if (prepro._M_string_length != 0) {
          ResolveTargetsInGeneratorExpressions
                    (this,&prepro,target,missingTargets,ReplaceFreeTargets);
          std::operator+(&local_1c8,"IMPORTED_LINK_INTERFACE_LIBRARIES",suffix);
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&local_1c8);
          std::__cxx11::string::_M_assign((string *)pmVar2);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
      }
    }
    std::__cxx11::string::~string((string *)&prepro);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkInterface(
  const std::string& config, std::string const& suffix,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::vector<std::string>& missingTargets)
{
  // Add the transitive link dependencies for this configuration.
  cmLinkInterface const* iface = target->GetLinkInterface(config, target);
  if (!iface) {
    return;
  }

  if (iface->ImplementationIsInterface) {
    // Policy CMP0022 must not be NEW.
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_INTERFACE_LIBRARIES",
                                iface->Libraries, properties, missingTargets);
    return;
  }

  const char* propContent;

  if (const char* prop_suffixed =
        target->GetProperty("LINK_INTERFACE_LIBRARIES" + suffix)) {
    propContent = prop_suffixed;
  } else if (const char* prop =
               target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    propContent = prop;
  } else {
    return;
  }

  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;

  if (newCMP0022Behavior && !this->ExportOld) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" has policy CMP0022 enabled, "
         "but also has old-style LINK_INTERFACE_LIBRARIES properties "
         "populated, but it was exported without the "
         "EXPORT_LINK_INTERFACE_LIBRARIES to export the old-style properties";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!*propContent) {
    properties["IMPORTED_LINK_INTERFACE_LIBRARIES" + suffix].clear();
    return;
  }

  std::string prepro =
    cmGeneratorExpression::Preprocess(propContent, preprocessRule);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets,
                                               ReplaceFreeTargets);
    properties["IMPORTED_LINK_INTERFACE_LIBRARIES" + suffix] = prepro;
  }
}